

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_symtab.c
# Opt level: O0

void lj_symtab_dump_trace(lj_wbuf *out,GCtrace *trace)

{
  BCLine BVar1;
  ulong n;
  long in_RSI;
  BCIns *startpc;
  BCLine lineno;
  GCproto *pt;
  undefined4 in_stack_ffffffffffffffe0;
  
  n = (ulong)*(uint *)(in_RSI + 0x34);
  BVar1 = lj_debug_line((GCproto *)(ulong)*(uint *)(in_RSI + 0x30),
                        (BCPos)((long)(n - (long)((GCproto *)(ulong)*(uint *)(in_RSI + 0x30) + 1))
                               >> 2));
  lj_wbuf_addu64((lj_wbuf *)CONCAT44(BVar1,in_stack_ffffffffffffffe0),n);
  lj_wbuf_addu64((lj_wbuf *)CONCAT44(BVar1,in_stack_ffffffffffffffe0),n);
  lj_wbuf_addu64((lj_wbuf *)CONCAT44(BVar1,in_stack_ffffffffffffffe0),n);
  return;
}

Assistant:

void lj_symtab_dump_trace(struct lj_wbuf *out, const GCtrace *trace)
{
  GCproto *pt = &gcref(trace->startpt)->pt;
  BCLine lineno = 0;

  const BCIns *startpc = mref(trace->startpc, const BCIns);
  lj_assertX(startpc >= proto_bc(pt) && startpc < proto_bc(pt) + pt->sizebc,
	     "start trace PC out of range");

  lineno = lj_debug_line(pt, proto_bcpos(pt, startpc));

  lj_wbuf_addu64(out, (uint64_t)trace->traceno);
  /*
  ** The information about the prototype, associated with the
  ** trace's start has already been dumped, as it is anchored
  ** via the trace and is not collected while the trace is alive.
  ** For this reason, we do not need to repeat dumping the chunk
  ** name for the prototype.
  */
  lj_wbuf_addu64(out, (uintptr_t)pt);
  lj_wbuf_addu64(out, (uint64_t)lineno);
}